

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.c
# Opt level: O2

int STATE_checkers_and_pinners
              (chess_state_t *s,bitboard_t *block_check,bitboard_t *pinners,bitboard_t *pinned)

{
  byte bVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  bitboard_t *pbVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  
  bVar1 = s->player;
  uVar9 = (ulong)bVar1;
  lVar2 = 0;
  if (s->bitboard[uVar9 * 7 + 5] != 0) {
    for (; (s->bitboard[uVar9 * 7 + 5] >> lVar2 & 1) == 0; lVar2 = lVar2 + 1) {
    }
  }
  *block_check = 0;
  *pinners = 0;
  uVar7 = uVar9 ^ 1;
  *pinned = 0;
  uVar5 = (ulong)(uint)((int)lVar2 * 8);
  uVar8 = s->bitboard[uVar7 * 7 + 1] & *(ulong *)((long)bitboard_knight + uVar5) |
          s->bitboard[uVar7 * 7] & *(ulong *)((long)bitboard_pawn_capture[bVar1] + uVar5);
  uVar5 = (s->bitboard[uVar7 * 7 + 4] | s->bitboard[uVar7 * 7 + 3]) &
          *(ulong *)((long)bitboard_rook + uVar5) |
          (s->bitboard[uVar7 * 7 + 2] | s->bitboard[uVar7 * 7 + 4]) &
          *(ulong *)((long)bitboard_bishop + uVar5);
  do {
    if (uVar5 == 0) {
      *block_check = *block_check | uVar8;
      uVar8 = uVar8 - (uVar8 >> 1 & 0x5555555555555555);
      uVar9 = (uVar8 >> 2 & 0x3333333333333333) + (uVar8 & 0x3333333333333333);
      return (int)(byte)(((uVar9 >> 4) + uVar9 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38);
    }
    lVar3 = 0;
    if (uVar5 != 0) {
      for (; (uVar5 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
      }
    }
    uVar10 = 1L << ((byte)lVar3 & 0x3f);
    uVar4 = *(ulong *)((long)bitboard_between[0] + lVar2 * 8 + (ulong)(uint)((int)lVar3 << 9));
    if ((s->bitboard[uVar7 * 7 + 6] & uVar4) == 0) {
      uVar11 = s->bitboard[uVar9 * 7 + 6] & uVar4;
      if (uVar11 == 0) {
        uVar8 = uVar8 | uVar10;
        pbVar6 = block_check;
      }
      else {
        if ((uVar11 ^ uVar11 - 1) <= uVar11 - 1) goto LAB_00106d9d;
        *pinners = *pinners | uVar10;
        uVar4 = uVar11;
        pbVar6 = pinned;
      }
      *pbVar6 = *pbVar6 | uVar4;
    }
LAB_00106d9d:
    uVar5 = uVar5 ^ uVar10;
  } while( true );
}

Assistant:

int STATE_checkers_and_pinners(const chess_state_t *s, bitboard_t *block_check, bitboard_t *pinners, bitboard_t *pinned)
{
    const int player = s->player;
    const int opponent = player ^ 1;
    const bitboard_t * player_bb = &s->bitboard[player * NUM_TYPES];
    const bitboard_t * opponent_bb = &s->bitboard[opponent * NUM_TYPES];
    int king_pos = BITBOARD_find_bit(player_bb[KING]);
    bitboard_t checkers = 0;
    *block_check = 0;
    *pinners = 0;
    *pinned = 0;

    /* Attacking pawns */
    checkers |= bitboard_pawn_capture[player][king_pos] & opponent_bb[PAWN];

    /* Attacking knights */
    checkers |= bitboard_knight[king_pos] & opponent_bb[KNIGHT];

    /* Attacking sliders */
    bitboard_t attackers = (bitboard_bishop[king_pos] & (opponent_bb[BISHOP] | opponent_bb[QUEEN])) |
                           (bitboard_rook[king_pos] & (opponent_bb[ROOK] | opponent_bb[QUEEN]));
    while(attackers) {
        int attack_pos = BITBOARD_find_bit(attackers);
        bitboard_t attacker_bb = BITBOARD_POSITION(attack_pos);
        bitboard_t between = bitboard_between[attack_pos][king_pos];
        bitboard_t own_between = between & player_bb[ALL];
        bitboard_t opponent_between = between & opponent_bb[ALL];

        if(opponent_between == 0) {
            if(own_between == 0) {
                /* Slider is checking */
                checkers |= attacker_bb;
                *block_check |= between;
            } else if(BITBOARD_count_bits(own_between) == 1) {
                /* Slider is pinning */
                *pinners |= attacker_bb;
                *pinned |= own_between;
            }
        }

        attackers ^= attacker_bb;
    }

    *block_check |= checkers;

    /* Return number of checkers */
    return BITBOARD_count_bits(checkers);
}